

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

char * transform_xml2json(ly_ctx *ctx,char *expr,lyxml_elem *xml,int use_ctx_data_clb,int log)

{
  char cVar1;
  lyxp_expr *expr_00;
  char *pcVar2;
  lyxml_ns *plVar3;
  lys_module *plVar4;
  ushort **ppuVar5;
  size_t sVar6;
  LY_ERR *pLVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  void *pvVar13;
  char *pcVar14;
  long lVar15;
  size_t sVar16;
  bool bVar17;
  size_t local_70;
  char *local_50;
  char *local_38;
  
  local_70 = strlen(expr);
  local_70 = local_70 + 1;
  local_38 = (char *)malloc(local_70);
  if (local_38 == (char *)0x0) {
    if (log != 0) {
      pLVar7 = &ly_err_location()->no;
      if ((ly_err *)pLVar7 == (ly_err *)0x0) {
        pLVar7 = &ly_errno_int;
      }
      ((ly_err *)pLVar7)->no = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
    }
  }
  else {
    expr_00 = lyxp_parse_expr(expr);
    if (expr_00 != (lyxp_expr *)0x0) {
      if (expr_00->used == 0) {
        local_50 = (char *)0x0;
      }
      else {
        uVar11 = 0;
        local_50 = (char *)0x0;
        do {
          pcVar14 = expr_00->expr + expr_00->expr_pos[uVar11];
          if ((uVar11 != 0) &&
             (uVar9 = (int)uVar11 - 1,
             pcVar12 = expr_00->expr +
                       (ulong)expr_00->tok_len[uVar9] + (ulong)expr_00->expr_pos[uVar9],
             pcVar12 != pcVar14)) {
            strncpy(local_38 + (long)local_50,pcVar12,(long)pcVar14 - (long)pcVar12);
            local_50 = local_50 + ((long)pcVar14 - (long)pcVar12);
          }
          uVar9 = (uint)expr_00->tok_len[uVar11];
          if (expr_00->tokens[uVar11] == LYXP_TOKEN_LITERAL) {
            cVar1 = *pcVar14;
            pcVar12 = pcVar14;
            uVar10 = uVar9;
            while (cVar1 != ':') {
              bVar17 = uVar10 == 0;
              uVar10 = uVar10 - 1;
              if ((cVar1 == '\0') || (bVar17)) goto LAB_0010ea95;
              pcVar2 = pcVar12 + 1;
              pcVar12 = pcVar12 + 1;
              cVar1 = *pcVar2;
            }
            ppuVar5 = __ctype_b_loc();
            lVar15 = 0;
            while ((((*ppuVar5)[pcVar12[lVar15 + -1]] & 8) != 0 ||
                   ((uVar9 = (byte)pcVar12[lVar15 + -1] - 0x2d, uVar9 < 0x33 &&
                    ((0x4000000000003U >> ((ulong)uVar9 & 0x3f) & 1) != 0))))) {
              lVar15 = lVar15 + -1;
            }
            sVar16 = (long)pcVar12 - (long)pcVar14;
            pcVar2 = strndup(pcVar14,sVar16);
            if (pcVar2 == (char *)0x0) {
              if (log == 0) goto LAB_0010ef4d;
              pLVar7 = &ly_err_location()->no;
joined_r0x0010ed9f:
              if ((ly_err *)pLVar7 == (ly_err *)0x0) {
                pLVar7 = &ly_errno_int;
              }
              ((ly_err *)pLVar7)->no = LY_EMEM;
LAB_0010ef3c:
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
              goto LAB_0010ef4d;
            }
            plVar3 = lyxml_get_ns(xml,pcVar2);
            free(pcVar2);
            if (plVar3 == (lyxml_ns *)0x0) {
              if (log != 0) {
                ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
                ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                        "XML namespace with prefix \"%.*s\" not defined.",sVar16,pcVar14);
              }
              goto LAB_0010ef4d;
            }
            plVar4 = ly_ctx_get_module_by_ns(ctx,plVar3->value,(char *)0x0);
            if (plVar4 == (lys_module *)0x0) {
              strncpy(local_38 + (long)local_50,expr_00->expr + expr_00->expr_pos[uVar11],
                      (ulong)expr_00->tok_len[uVar11]);
              local_50 = local_50 + expr_00->tok_len[uVar11];
            }
            else {
              sVar6 = strlen(plVar4->name);
              local_70 = local_70 + (sVar6 - sVar16);
              pcVar2 = (char *)realloc(local_38,local_70);
              if (pcVar2 == (char *)0x0) {
                free(local_38);
                if (log != 0) {
                  pLVar7 = &ly_err_location()->no;
                  if ((ly_err *)pLVar7 == (ly_err *)0x0) {
                    pLVar7 = &ly_errno_int;
                  }
                  ((ly_err *)pLVar7)->no = LY_EMEM;
                  local_38 = (char *)0x0;
                  goto LAB_0010ef3c;
                }
                goto LAB_0010ef47;
              }
              strncpy(pcVar2 + (long)local_50,pcVar14,sVar16 + lVar15);
              local_50 = pcVar12 + (long)(local_50 + (lVar15 - (long)pcVar14));
              strcpy(pcVar2 + (long)local_50,plVar4->name);
              sVar16 = strlen(plVar4->name);
              strncpy(pcVar2 + (long)local_50 + sVar16,pcVar12,
                      ((long)pcVar14 * 2 + (long)pcVar12 * -2 + (ulong)expr_00->tok_len[uVar11]) -
                      lVar15);
              local_50 = local_50 +
                         (ulong)expr_00->tok_len[uVar11] +
                         (sVar16 - ((long)pcVar12 * 2 + (long)pcVar14 * -2 + lVar15));
              local_38 = pcVar2;
            }
          }
          else {
            if (expr_00->tokens[uVar11] != LYXP_TOKEN_NAMETEST) {
LAB_0010ea95:
              strncpy(local_38 + (long)local_50,expr_00->expr + expr_00->expr_pos[uVar11],
                      (ulong)uVar9);
              local_50 = local_50 + expr_00->tok_len[uVar11];
              goto LAB_0010ecf7;
            }
            cVar1 = *pcVar14;
            pcVar12 = pcVar14;
            uVar10 = uVar9;
            while (cVar1 != ':') {
              bVar17 = uVar10 == 0;
              uVar10 = uVar10 - 1;
              if ((cVar1 == '\0') || (bVar17)) goto LAB_0010ea95;
              pcVar2 = pcVar12 + 1;
              pcVar12 = pcVar12 + 1;
              cVar1 = *pcVar2;
            }
            sVar16 = (long)pcVar12 - (long)pcVar14;
            pcVar2 = strndup(pcVar14,sVar16);
            if (pcVar2 == (char *)0x0) {
              if (log == 0) goto LAB_0010ef4d;
              pLVar7 = &ly_err_location()->no;
              goto joined_r0x0010ed9f;
            }
            plVar3 = lyxml_get_ns(xml,pcVar2);
            free(pcVar2);
            if (plVar3 == (lyxml_ns *)0x0) {
              if (log != 0) {
                ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
                ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                        "XML namespace with prefix \"%.*s\" not defined.",sVar16,pcVar14);
              }
              goto LAB_0010ef4d;
            }
            plVar4 = ly_ctx_get_module_by_ns(ctx,plVar3->value,(char *)0x0);
            if ((use_ctx_data_clb == 0) || (ctx->data_clb == (ly_module_data_clb)0x0)) {
LAB_0010ec54:
              if (plVar4 == (lys_module *)0x0) {
                if (log != 0) {
                  ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"module namespace");
                  ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                          "Module with the namespace \"%s\" could not be found.",plVar3->value);
                }
                goto LAB_0010ef4d;
              }
            }
            else {
              if (plVar4 == (lys_module *)0x0) {
                pcVar2 = plVar3->value;
                pvVar13 = ctx->data_clb_data;
                pcVar14 = (char *)0x0;
                iVar8 = 0;
LAB_0010ec4f:
                plVar4 = (*ctx->data_clb)(ctx,pcVar14,pcVar2,iVar8,pvVar13);
                goto LAB_0010ec54;
              }
              if (-1 < (char)plVar4->field_0x40) {
                pcVar14 = plVar4->name;
                pcVar2 = plVar4->ns;
                pvVar13 = ctx->data_clb_data;
                iVar8 = 1;
                goto LAB_0010ec4f;
              }
            }
            sVar6 = strlen(plVar4->name);
            local_70 = local_70 + (sVar6 - sVar16);
            pcVar14 = (char *)realloc(local_38,local_70);
            if (pcVar14 == (char *)0x0) {
              free(local_38);
              if (log != 0) {
                pLVar7 = &ly_err_location()->no;
                if ((ly_err *)pLVar7 == (ly_err *)0x0) {
                  pLVar7 = &ly_errno_int;
                }
                ((ly_err *)pLVar7)->no = LY_EMEM;
                local_38 = (char *)0x0;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
                goto LAB_0010ef4d;
              }
LAB_0010ef47:
              local_38 = (char *)0x0;
LAB_0010ef4d:
              free(local_38);
              lyxp_expr_free(expr_00);
              return (char *)0x0;
            }
            strcpy(pcVar14 + (long)local_50,plVar4->name);
            sVar6 = strlen(plVar4->name);
            strncpy(pcVar14 + (long)(local_50 + sVar6),pcVar12,expr_00->tok_len[uVar11] - sVar16);
            local_50 = local_50 + sVar6 + (expr_00->tok_len[uVar11] - sVar16);
            local_38 = pcVar14;
          }
LAB_0010ecf7:
          uVar11 = uVar11 + 1;
        } while (uVar11 < expr_00->used);
      }
      local_38[(long)local_50] = '\0';
      lyxp_expr_free(expr_00);
      pcVar14 = lydict_insert_zc(ctx,local_38);
      return pcVar14;
    }
    free(local_38);
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_xml2json(struct ly_ctx *ctx, const char *expr, struct lyxml_elem *xml, int use_ctx_data_clb, int log)
{
    const char *end, *cur_expr, *ptr;
    char *out, *prefix;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    const struct lyxml_ns *ns;
    struct lyxp_expr *exp;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        if (log) {
            LOGMEM;
        }
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        free(out);
        return NULL;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (use_ctx_data_clb && ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, NULL, ns->value, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            if (!mod) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "module namespace");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "Module with the namespace \"%s\" could not be found.", ns->value);
                }
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    if (log) {
                        LOGMEM;
                    }
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}